

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O2

size_t FSE_readNCount(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                     size_t hbSize)

{
  int iVar1;
  uint *puVar2;
  bool bVar3;
  uint symbNb;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  uint uVar7;
  BYTE *istart;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint *puVar11;
  uint uVar12;
  uint *puVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  
  if (hbSize < 4) {
    return 0xffffffffffffffb8;
  }
  uVar16 = *headerBuffer & 0xf;
  if (uVar16 < 0xb) {
    uVar18 = *headerBuffer >> 4;
    *tableLogPtr = uVar16 + 5;
    iVar20 = 0x20 << (sbyte)uVar16;
    iVar9 = iVar20 + 1;
    iVar17 = uVar16 + 6;
    uVar16 = *maxSVPtr;
    puVar2 = (uint *)((long)headerBuffer + (hbSize - 7));
    puVar11 = (uint *)((long)headerBuffer + (hbSize - 4));
    bVar21 = true;
    uVar7 = 4;
    uVar8 = 0;
    puVar13 = (uint *)headerBuffer;
LAB_00175ebf:
    uVar15 = (uint)uVar8;
    if ((1 < iVar9) && (uVar15 <= uVar16)) {
      uVar19 = uVar8;
      uVar15 = uVar7;
      if (!bVar21) {
        do {
          uVar7 = uVar15 + 2;
          while( true ) {
            if ((short)uVar18 != -1) goto LAB_00175f22;
            if (puVar13 < (uint *)((long)headerBuffer + (hbSize - 5))) break;
            uVar18 = uVar18 >> 0x10;
            uVar15 = uVar15 + 0x10;
            uVar19 = (ulong)((int)uVar19 + 0x18);
            uVar7 = uVar7 + 0x10;
          }
          puVar14 = (uint *)((long)puVar13 + 2);
          puVar13 = (uint *)((long)puVar13 + 2);
          uVar18 = *puVar14 >> ((byte)uVar15 & 0x1f);
          uVar19 = (ulong)((int)uVar19 + 0x18);
        } while( true );
      }
      goto LAB_00175f79;
    }
    sVar6 = 0xffffffffffffffec;
    if ((iVar9 == 1) && ((int)uVar7 < 0x21)) {
      for (; (uint)uVar8 <= uVar16; uVar8 = (ulong)((uint)uVar8 + 1)) {
        normalizedCounter[uVar8] = 0;
      }
      *maxSVPtr = uVar15 - 1;
      sVar6 = (long)puVar13 + ((long)((int)(uVar7 + 7) >> 3) - (long)headerBuffer);
    }
  }
  else {
    sVar6 = 0xffffffffffffffd4;
  }
  return sVar6;
LAB_00175f22:
  for (; (~uVar18 & 3) == 0; uVar18 = uVar18 >> 2) {
    uVar19 = (ulong)((int)uVar19 + 3);
    uVar7 = uVar7 + 2;
  }
  uVar15 = (uVar18 & 3) + (int)uVar19;
  if (uVar16 < uVar15) {
    return 0xffffffffffffffd0;
  }
  for (; uVar8 < uVar15; uVar8 = uVar8 + 1) {
    normalizedCounter[uVar8] = 0;
  }
  iVar4 = (int)uVar7 >> 3;
  puVar14 = (uint *)((long)puVar13 + (long)iVar4);
  if ((puVar2 < puVar13) && (puVar11 < puVar14)) {
    uVar18 = uVar18 >> 2;
  }
  else {
    uVar7 = uVar7 & 7;
    uVar18 = *(uint *)((long)puVar13 + (long)iVar4) >> (sbyte)uVar7;
    puVar13 = puVar14;
  }
LAB_00175f79:
  uVar15 = iVar20 * 2 - 1;
  uVar5 = uVar15 - iVar9;
  uVar12 = iVar20 - 1U & uVar18;
  if (uVar12 < uVar5) {
    iVar4 = iVar17 + -1;
  }
  else {
    uVar18 = uVar18 & uVar15;
    if ((int)uVar18 < iVar20) {
      uVar5 = 0;
    }
    uVar12 = uVar18 - uVar5;
    iVar4 = iVar17;
  }
  iVar1 = uVar12 - 1;
  iVar10 = 1 - uVar12;
  if (0 < (int)uVar12) {
    iVar10 = iVar1;
  }
  iVar9 = iVar9 - iVar10;
  normalizedCounter[uVar8 & 0xffffffff] = (short)iVar1;
  for (; iVar9 < iVar20; iVar20 = iVar20 >> 1) {
    iVar17 = iVar17 + -1;
  }
  uVar18 = iVar4 + uVar7;
  uVar8 = (ulong)((int)uVar8 + 1);
  bVar21 = iVar1 != 0;
  bVar3 = puVar13 <= puVar2;
  puVar14 = (uint *)((long)((int)uVar18 >> 3) + (long)puVar13);
  iVar4 = (int)puVar13;
  puVar13 = puVar14;
  if (!bVar3 && puVar14 > puVar11) {
    puVar13 = puVar11;
  }
  uVar7 = uVar18 + (iVar4 - (int)puVar11) * 8;
  if (bVar3 || puVar14 <= puVar11) {
    uVar7 = uVar18 & 7;
  }
  uVar18 = *puVar13 >> ((byte)uVar7 & 0x1f);
  goto LAB_00175ebf;
}

Assistant:

size_t FSE_readNCount (short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
                 const void* headerBuffer, size_t hbSize)
{
    const BYTE* const istart = (const BYTE*) headerBuffer;
    const BYTE* const iend = istart + hbSize;
    const BYTE* ip = istart;
    int nbBits;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    if (hbSize < 4) return ERROR(srcSize_wrong);
    bitStream = MEM_readLE32(ip);
    nbBits = (bitStream & 0xF) + FSE_MIN_TABLELOG;   /* extract tableLog */
    if (nbBits > FSE_TABLELOG_ABSOLUTE_MAX) return ERROR(tableLog_tooLarge);
    bitStream >>= 4;
    bitCount = 4;
    *tableLogPtr = nbBits;
    remaining = (1<<nbBits)+1;
    threshold = 1<<nbBits;
    nbBits++;

    while ((remaining>1) & (charnum<=*maxSVPtr)) {
        if (previous0) {
            unsigned n0 = charnum;
            while ((bitStream & 0xFFFF) == 0xFFFF) {
                n0 += 24;
                if (ip < iend-5) {
                    ip += 2;
                    bitStream = MEM_readLE32(ip) >> bitCount;
                } else {
                    bitStream >>= 16;
                    bitCount   += 16;
            }   }
            while ((bitStream & 3) == 3) {
                n0 += 3;
                bitStream >>= 2;
                bitCount += 2;
            }
            n0 += bitStream & 3;
            bitCount += 2;
            if (n0 > *maxSVPtr) return ERROR(maxSymbolValue_tooSmall);
            while (charnum < n0) normalizedCounter[charnum++] = 0;
            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
                bitStream = MEM_readLE32(ip) >> bitCount;
            } else {
                bitStream >>= 2;
        }   }
        {   int const max = (2*threshold-1) - remaining;
            int count;

            if ((bitStream & (threshold-1)) < (U32)max) {
                count = bitStream & (threshold-1);
                bitCount += nbBits-1;
            } else {
                count = bitStream & (2*threshold-1);
                if (count >= threshold) count -= max;
                bitCount += nbBits;
            }

            count--;   /* extra accuracy */
            remaining -= count < 0 ? -count : count;   /* -1 means +1 */
            normalizedCounter[charnum++] = (short)count;
            previous0 = !count;
            while (remaining < threshold) {
                nbBits--;
                threshold >>= 1;
            }

            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
            } else {
                bitCount -= (int)(8 * (iend - 4 - ip));
                ip = iend - 4;
            }
            bitStream = MEM_readLE32(ip) >> (bitCount & 31);
    }   }   /* while ((remaining>1) & (charnum<=*maxSVPtr)) */
    if (remaining != 1) return ERROR(corruption_detected);
    if (bitCount > 32) return ERROR(corruption_detected);
    /* zeroise the rest */
    {   unsigned symbNb = charnum;
        for (symbNb=charnum; symbNb <= *maxSVPtr; symbNb++)
            normalizedCounter[symbNb] = 0;
    }
    *maxSVPtr = charnum-1;

    ip += (bitCount+7)>>3;
    return ip-istart;
}